

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O2

void * dsPtr(uint64_t offset,uint64_t length)

{
  dsCrate *crate;
  void *pvVar1;
  
  crate = getActiveCrate();
  if (crate != (dsCrate *)0x0) {
    pvVar1 = mapObject(crate,offset,length);
    return pvVar1;
  }
  dsRunLogCallback("%s(): Can\'t get active crate.\n","dsPtr");
  return (void *)0x0;
}

Assistant:

void *
dsPtr(uint64_t offset, uint64_t length)
{
	dsCrate *crate;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return NULL;
	}

	return mapObject(crate, offset, length);
}